

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O0

void __thiscall FSoftwareRenderer::PrecacheTexture(FSoftwareRenderer *this,FTexture *tex,int cache)

{
  undefined1 local_28 [8];
  Span *spanp;
  FTexture *pFStack_18;
  int cache_local;
  FTexture *tex_local;
  FSoftwareRenderer *this_local;
  
  if (tex != (FTexture *)0x0) {
    spanp._4_4_ = cache;
    pFStack_18 = tex;
    tex_local = (FTexture *)this;
    if ((cache & 0xdU) == 0) {
      if (cache == 0) {
        (*tex->_vptr_FTexture[9])();
      }
      else {
        (*tex->_vptr_FTexture[3])();
      }
    }
    else {
      (*tex->_vptr_FTexture[2])(tex,0,local_28);
    }
  }
  return;
}

Assistant:

void FSoftwareRenderer::PrecacheTexture(FTexture *tex, int cache)
{
	if (tex != NULL)
	{
		if (cache & FTextureManager::HIT_Columnmode)
		{
			const FTexture::Span *spanp;
			tex->GetColumn(0, &spanp);
		}
		else if (cache != 0)
		{
			tex->GetPixels ();
		}
		else
		{
			tex->Unload ();
		}
	}
}